

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void update_smooth_effects_playing(IT_PLAYING *playing)

{
  int iVar1;
  long in_RDI;
  
  *(char *)(in_RDI + 0x54) =
       *(char *)(in_RDI + 0x54) + *(char *)(in_RDI + 0x53) * *(char *)(in_RDI + 0x51) * '\x04';
  *(char *)(in_RDI + 0x58) = *(char *)(in_RDI + 0x58) + *(char *)(in_RDI + 0x56) * '\x04';
  *(char *)(in_RDI + 0x5c) = *(char *)(in_RDI + 0x5c) + *(char *)(in_RDI + 0x5a);
  if (*(char *)(in_RDI + 0x5d) == '\x03') {
    iVar1 = rand();
    *(char *)(in_RDI + 0x5e) = (char)(iVar1 % 0x81) + -0x40;
  }
  return;
}

Assistant:

static void update_smooth_effects_playing(IT_PLAYING *playing)
{
	playing->vibrato_time += playing->vibrato_n *
		(playing->vibrato_speed << 2);
	playing->tremolo_time += playing->tremolo_speed << 2;
	playing->panbrello_time += playing->panbrello_speed;
	if (playing->panbrello_waveform == 3)
		playing->panbrello_random = (rand() % 129) - 64;
}